

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleCalendarWidget::child(QAccessibleCalendarWidget *this,int index)

{
  int iVar1;
  QWidget *pQVar2;
  QAccessibleInterface *pQVar3;
  QObject *pQVar4;
  int in_ESI;
  QAccessibleCalendarWidget *in_RDI;
  QAccessibleCalendarWidget *this_00;
  
  if ((in_ESI < 0) ||
     (this_00 = in_RDI, iVar1 = (**(code **)(*(long *)&in_RDI->super_QAccessibleWidget + 0x50))(),
     iVar1 <= in_ESI)) {
    return (QAccessibleInterface *)0x0;
  }
  iVar1 = (**(code **)(*(long *)&in_RDI->super_QAccessibleWidget + 0x50))();
  if ((1 < iVar1) && (in_ESI == 0)) {
    pQVar2 = navigationBar(this_00);
    pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(&pQVar2->super_QObject);
    return pQVar3;
  }
  pQVar4 = (QObject *)calendarView(this_00);
  pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar4);
  return pQVar3;
}

Assistant:

QAccessibleInterface *QAccessibleCalendarWidget::child(int index) const
{
    if (index < 0 || index >= childCount())
        return nullptr;

    if (childCount() > 1 && index == 0)
        return QAccessible::queryAccessibleInterface(navigationBar());

    return QAccessible::queryAccessibleInterface(calendarView());
}